

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O2

void * v2i_issuer_alt(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  int iVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  CONF_VALUE *cnf;
  GENERAL_NAME *a;
  X509_EXTENSION *ext;
  OPENSSL_STACK *sk_00;
  void *p;
  size_t j;
  ulong i;
  ulong i_00;
  
  sk = OPENSSL_sk_new_null();
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_0040eb0d:
    sk = (OPENSSL_STACK *)0x0;
  }
  else {
    for (i_00 = 0; sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval), i_00 < sVar2; i_00 = i_00 + 1) {
      cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,i_00);
      iVar1 = x509v3_conf_name_matches(cnf->name,"issuer");
      if (((iVar1 == 0) || (cnf->value == (char *)0x0)) ||
         (iVar1 = strcmp(cnf->value,"copy"), iVar1 != 0)) {
        a = v2i_GENERAL_NAME((X509V3_EXT_METHOD *)method,(X509V3_CTX *)ctx,cnf);
        if ((a != (GENERAL_NAME *)0x0) && (sVar2 = OPENSSL_sk_push(sk,a), sVar2 != 0))
        goto LAB_0040ea24;
        GENERAL_NAME_free(a);
LAB_0040eafe:
        sk_GENERAL_NAME_pop_free((stack_st_GENERAL_NAME *)sk,GENERAL_NAME_free);
        goto LAB_0040eb0d;
      }
      if (ctx == (X509V3_CTX *)0x0) {
LAB_0040eae2:
        ERR_put_error(0x14,0,0x8d,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                      ,0x108);
        goto LAB_0040eafe;
      }
      if (ctx->flags != 1) {
        if ((X509 *)ctx->issuer_cert == (X509 *)0x0) goto LAB_0040eae2;
        iVar1 = X509_get_ext_by_NID((X509 *)ctx->issuer_cert,0x55,-1);
        if (-1 < iVar1) {
          ext = X509_get_ext((X509 *)ctx->issuer_cert,iVar1);
          if ((ext == (X509_EXTENSION *)0x0) ||
             (sk_00 = (OPENSSL_STACK *)X509V3_EXT_d2i(ext), sk_00 == (OPENSSL_STACK *)0x0)) {
            ERR_put_error(0x14,0,0x88,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                          ,0x115);
            sk_00 = (OPENSSL_STACK *)0x0;
LAB_0040eadb:
            GENERAL_NAMES_free((GENERAL_NAMES *)sk_00);
            goto LAB_0040eafe;
          }
          for (i = 0; sVar2 = OPENSSL_sk_num(sk_00), i < sVar2; i = i + 1) {
            p = OPENSSL_sk_value(sk_00,i);
            sVar2 = OPENSSL_sk_push(sk,p);
            if (sVar2 == 0) goto LAB_0040eadb;
            OPENSSL_sk_set(sk_00,i,(void *)0x0);
          }
          GENERAL_NAMES_free((GENERAL_NAMES *)sk_00);
        }
      }
LAB_0040ea24:
    }
  }
  return sk;
}

Assistant:

static void *v2i_issuer_alt(const X509V3_EXT_METHOD *method,
                            const X509V3_CTX *ctx,
                            const STACK_OF(CONF_VALUE) *nval) {
  GENERAL_NAMES *gens = sk_GENERAL_NAME_new_null();
  if (gens == NULL) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    if (x509v3_conf_name_matches(cnf->name, "issuer") && cnf->value &&
        !strcmp(cnf->value, "copy")) {
      if (!copy_issuer(ctx, gens)) {
        goto err;
      }
    } else {
      GENERAL_NAME *gen = v2i_GENERAL_NAME(method, ctx, cnf);
      if (gen == NULL || !sk_GENERAL_NAME_push(gens, gen)) {
        GENERAL_NAME_free(gen);
        goto err;
      }
    }
  }
  return gens;
err:
  sk_GENERAL_NAME_pop_free(gens, GENERAL_NAME_free);
  return NULL;
}